

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg4U
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,uint slotIndex
          )

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot R1_00;
  RegSlot RVar4;
  RegSlot R3_00;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  uint local_44;
  uint local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_34 = R3;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x8);
  local_40 = (uint)CONCAT62(in_register_00000032,op);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x21f,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0089b9d1;
    *puVar5 = 0;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0089b9d1;
      *puVar5 = 0;
    }
    local_3c = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_0089b9d1;
        *puVar5 = 0;
      }
      R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
      RVar2 = local_34;
      if (R2 != 0xffffffff) {
        if (this->m_functionWrite == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_0089b9d1;
          *puVar5 = 0;
        }
        RVar4 = FunctionBody::MapRegSlot(this->m_functionWrite,R2);
        if (RVar2 != 0xffffffff) {
          local_38 = RVar4;
          if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_0089b8cf:
            R3_00 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar2);
            RVar4 = local_38;
            RVar2 = local_3c;
            local_34 = local_40 & 0xffff;
            bVar3 = TryWriteReg4U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                              (this,(OpCode)local_40,local_3c,R1_00,local_38,R3_00,slotIndex);
            if (!bVar3) {
              bVar3 = TryWriteReg4U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                                (this,(OpCode)local_34,RVar2,R1_00,RVar4,R3_00,slotIndex);
              if (!bVar3) {
                local_54 = RVar2;
                local_4c = RVar4;
                local_44 = slotIndex;
                local_50 = R1_00;
                local_48 = R3_00;
                Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
                Data::Write(&this->m_byteCodeData,&local_54,0x14);
              }
            }
            return;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (bVar3) {
            *puVar5 = 0;
            goto LAB_0089b8cf;
          }
          goto LAB_0089b9d1;
        }
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_0089b9d1:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg4U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, uint slotIndex)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg4U);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);

        MULTISIZE_LAYOUT_WRITE(Reg4U, op, R0, R1, R2, R3, slotIndex);
    }